

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxquality.hpp
# Opt level: O2

void __thiscall
soplex::SPxSolverBase<double>::qualSlackViolation
          (SPxSolverBase<double> *this,double *maxviol,double *sumviol)

{
  uint uVar1;
  int iVar2;
  Item *pIVar3;
  DataKey *pDVar4;
  Nonzero<double> *pNVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  VectorBase<double> slacks;
  VectorBase<double> solu;
  _Vector_base<double,_std::allocator<double>_> local_50;
  _Vector_base<double,_std::allocator<double>_> local_38;
  
  *maxviol = 0.0;
  *sumviol = 0.0;
  VectorBase<double>::VectorBase
            ((VectorBase<double> *)&local_38,
             (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
             thenum);
  VectorBase<double>::VectorBase
            ((VectorBase<double> *)&local_50,
             (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
             thenum);
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x60])(this,&local_38);
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x61])(this,&local_50);
  uVar1 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
          thenum;
  pIVar3 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
           theitem;
  pDVar4 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
           thekey;
  uVar6 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar6 = 0;
  }
  for (uVar7 = 0; uVar7 != uVar6; uVar7 = uVar7 + 1) {
    iVar2 = pDVar4[uVar7].idx;
    uVar1 = pIVar3[iVar2].data.super_SVectorBase<double>.memused;
    uVar8 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar8 = 0;
    }
    dVar10 = 0.0;
    for (lVar9 = 0; uVar8 * 0x10 != lVar9; lVar9 = lVar9 + 0x10) {
      pNVar5 = pIVar3[iVar2].data.super_SVectorBase<double>.m_elem;
      dVar10 = dVar10 + *(double *)((long)&pNVar5->val + lVar9) *
                        local_38._M_impl.super__Vector_impl_data._M_start
                        [*(int *)((long)&pNVar5->idx + lVar9)];
    }
    dVar10 = ABS(dVar10 - local_50._M_impl.super__Vector_impl_data._M_start[uVar7]);
    if (*maxviol <= dVar10 && dVar10 != *maxviol) {
      *maxviol = dVar10;
    }
    *sumviol = *sumviol + dVar10;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_50);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

void SPxSolverBase<R>::qualSlackViolation(R& maxviol, R& sumviol) const
{
   maxviol = 0.0;
   sumviol = 0.0;

   VectorBase<R> solu(this->nCols());
   VectorBase<R> slacks(this->nRows());

   getPrimalSol(solu);
   getSlacks(slacks);

   for(int row = 0; row < this->nRows(); ++row)
   {
      const SVectorBase<R>& rowvec = this->rowVector(row);

      R val = 0.0;

      for(int col = 0; col < rowvec.size(); ++col)
         val += rowvec.value(col) * solu[rowvec.index(col)];

      R viol = spxAbs(val - slacks[row]);

      if(viol > maxviol)
         maxviol = viol;

      sumviol += viol;
   }
}